

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature_advanced.c
# Opt level: O0

int main(int argc,char **args)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  light_option option;
  uint32_t *puVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_RSI;
  int in_EDI;
  FILE *ctx;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double f;
  uint8_t destination [4];
  uint8_t source [4];
  uint8_t *label;
  light_option address_option;
  light_option feature_option;
  uint64_t feature_values [64];
  light_pcapng pcapng;
  char *file;
  uint64_t **feature_table;
  uint64_t *max_features;
  uint64_t *min_features;
  FILE *features_raw;
  FILE *features_csv;
  int j;
  int i;
  uint in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  uint in_stack_fffffffffffffd70;
  uint16_t in_stack_fffffffffffffd74;
  uint16_t in_stack_fffffffffffffd76;
  light_option in_stack_fffffffffffffd78;
  light_pcapng in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd88;
  byte in_stack_fffffffffffffd89;
  byte in_stack_fffffffffffffd8a;
  byte in_stack_fffffffffffffd8b;
  byte in_stack_fffffffffffffd8c;
  byte in_stack_fffffffffffffd8d;
  byte in_stack_fffffffffffffd8e;
  byte in_stack_fffffffffffffd8f;
  uint64_t local_258 [64];
  light_pcapng local_58;
  undefined8 local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  FILE *local_30;
  FILE *local_28;
  int local_20;
  int local_1c;
  long local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_18 = in_RSI;
  local_10 = in_EDI;
  local_28 = fopen("features/unscaled.csv","w");
  local_30 = fopen("features/raw.dat","w");
  local_38 = (void *)0x0;
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  iVar3 = compile_features();
  if (iVar3 == 0) {
    iVar3 = extract_features();
    if (iVar3 == 0) {
      local_38 = calloc((long)feature_count,8);
      memset(local_38,0xff,(long)feature_count << 3);
      local_40 = calloc((long)feature_count,8);
      local_48 = calloc((long)(local_10 + -1),8);
      for (local_1c = 0; local_1c < local_10 + -1; local_1c = local_1c + 1) {
        pvVar4 = calloc((long)feature_count,8);
        *(void **)((long)local_48 + (long)local_1c * 8) = pvVar4;
      }
      fprintf(local_28,"address1, address2");
      for (local_1c = 0; local_1c < feature_count; local_1c = local_1c + 1) {
        fprintf(local_28,", %s",feature_names[local_1c]);
      }
      fprintf(local_28,"\n");
      printf("Running feature extraction with %d functions and %d traces\n",
             (ulong)(uint)feature_count,(ulong)(local_10 - 1));
      for (local_1c = 1; local_1c < local_10; local_1c = local_1c + 1) {
        local_50 = *(undefined8 *)(local_18 + (long)local_1c * 8);
        local_58 = light_read_from_path((char *)in_stack_fffffffffffffd78);
        if (local_58 == (light_pcapng)0x0) {
          fprintf(_stderr,"Unable to read pcapng: %s\n",local_50);
        }
        else {
          option = light_get_option(local_58,0xadd4);
          if (option == (light_option)0x0) {
            fprintf(local_28,"unknown, unknown");
          }
          else {
            puVar5 = light_get_option_data(option);
            if ((char)*puVar5 == '\x04') {
              uVar1 = *(undefined4 *)((long)puVar5 + 1);
              in_stack_fffffffffffffd8c = (byte)uVar1;
              in_stack_fffffffffffffd8d = (byte)((uint)uVar1 >> 8);
              in_stack_fffffffffffffd8e = (byte)((uint)uVar1 >> 0x10);
              in_stack_fffffffffffffd8f = (byte)((uint)uVar1 >> 0x18);
              uVar2 = *(uint *)((long)puVar5 + 5);
              in_stack_fffffffffffffd88 = (undefined1)uVar2;
              in_stack_fffffffffffffd89 = (byte)(uVar2 >> 8);
              in_stack_fffffffffffffd8a = (byte)(uVar2 >> 0x10);
              in_stack_fffffffffffffd8b = (byte)(uVar2 >> 0x18);
              in_stack_fffffffffffffd68 = (uint)in_stack_fffffffffffffd8a;
              in_stack_fffffffffffffd70 = (uint)in_stack_fffffffffffffd8b;
              fprintf(local_28,"%u.%u.%u.%u, %u.%u.%u.%u",(ulong)in_stack_fffffffffffffd8c,
                      (ulong)in_stack_fffffffffffffd8d,(ulong)in_stack_fffffffffffffd8e,
                      (ulong)in_stack_fffffffffffffd8f,uVar2 & 0xff,(uint)in_stack_fffffffffffffd89)
              ;
            }
            else if ((char)*puVar5 == '\x06') {
              fprintf(local_28,"ipv6, ipv6");
            }
            else {
              fprintf(local_28,"unknown, unknown");
            }
          }
          printf("Extract features for %s\n",local_50);
          for (local_20 = 0; local_20 < feature_count; local_20 = local_20 + 1) {
            uVar6 = (*features[local_20])(local_58);
            local_258[local_20] = uVar6;
            fprintf(local_28,", %lu",local_258[local_20]);
            *(uint64_t *)
             (*(long *)((long)local_48 + (long)(local_1c + -1) * 8) + (long)local_20 * 8) =
                 local_258[local_20];
            if (local_258[local_20] != 0xffffffffffffffff) {
              if (*(ulong *)(*(long *)((long)local_48 + (long)(local_1c + -1) * 8) +
                            (long)local_20 * 8) < *(ulong *)((long)local_38 + (long)local_20 * 8)) {
                *(undefined8 *)((long)local_38 + (long)local_20 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_48 + (long)(local_1c + -1) * 8) + (long)local_20 * 8);
              }
              if (*(ulong *)((long)local_40 + (long)local_20 * 8) <
                  *(ulong *)(*(long *)((long)local_48 + (long)(local_1c + -1) * 8) +
                            (long)local_20 * 8)) {
                *(undefined8 *)((long)local_40 + (long)local_20 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_48 + (long)(local_1c + -1) * 8) + (long)local_20 * 8);
              }
            }
          }
          fprintf(local_28,"\n");
          light_create_option(in_stack_fffffffffffffd76,in_stack_fffffffffffffd74,
                              (void *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68))
          ;
          light_update_option((light_pcapng)
                              CONCAT17(in_stack_fffffffffffffd8f,
                                       CONCAT16(in_stack_fffffffffffffd8e,
                                                CONCAT15(in_stack_fffffffffffffd8d,
                                                         CONCAT14(in_stack_fffffffffffffd8c,
                                                                  CONCAT13(in_stack_fffffffffffffd8b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd8a,
                                                  CONCAT11(in_stack_fffffffffffffd89,
                                                           in_stack_fffffffffffffd88))))))),
                              in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          light_pcapng_to_file
                    ((char *)CONCAT26(in_stack_fffffffffffffd76,
                                      CONCAT24(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70))
                     ,(light_pcapng)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          light_free_option((light_option)0x1028b5);
          light_pcapng_release
                    ((light_pcapng)
                     CONCAT26(in_stack_fffffffffffffd76,
                              CONCAT24(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)));
        }
      }
      fclose(local_28);
      printf("Start exporting double features!\n");
      fprintf(local_30,"%% %d features\n",(ulong)(uint)feature_count);
      fprintf(local_30,"%% %d items\n",(ulong)(local_10 - 1));
      for (local_1c = 0; local_1c < local_10 + -1; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < feature_count; local_20 = local_20 + 1) {
          if (*(long *)(*(long *)((long)local_48 + (long)local_1c * 8) + (long)local_20 * 8) == -1)
          {
            fprintf(local_30,"%.6lf ");
          }
          else {
            lVar9 = (long)local_20;
            lVar8 = *(long *)((long)local_38 + lVar9 * 8);
            lVar7 = *(long *)(*(long *)((long)local_48 + (long)local_1c * 8) + lVar9 * 8) - lVar8;
            auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar10._0_8_ = lVar7;
            auVar10._12_4_ = 0x45300000;
            lVar8 = *(long *)((long)local_40 + lVar9 * 8) - lVar8;
            auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
            auVar11._0_8_ = lVar8;
            auVar11._12_4_ = 0x45300000;
            fprintf(local_30,"%.6lf ",
                    ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                    ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
          }
        }
        fprintf(local_30,"\n");
      }
      ctx = local_30;
      fclose(local_30);
      cleanup((EVP_PKEY_CTX *)ctx);
      local_c = 0;
    }
    else {
      fprintf(_stderr,"Unable to extract function pointers!\n");
      local_c = 1;
    }
  }
  else {
    fprintf(_stderr,"Unable to compile features!\n");
    local_c = 1;
  }
  return local_c;
}

Assistant:

int main(int argc, const char **args) {
	int i, j;
	FILE *features_csv = fopen("features/unscaled.csv", "w");
	FILE *features_raw = fopen("features/raw.dat", "w");
	uint64_t *min_features = NULL;
	uint64_t *max_features = NULL;
	uint64_t **feature_table = NULL;

	if (compile_features() != 0) {
		fprintf(stderr, "Unable to compile features!\n");
		return EXIT_FAILURE;
	}

	if (extract_features() != 0) {
		fprintf(stderr, "Unable to extract function pointers!\n");
		return EXIT_FAILURE;
	}

	min_features = calloc(feature_count, sizeof(uint64_t));
	memset(min_features, -1, feature_count * sizeof(uint64_t));

	max_features = calloc(feature_count, sizeof(uint64_t));
	feature_table = calloc(argc - 1, sizeof(uint64_t *));
	for (i = 0; i < argc - 1; ++i) {
		feature_table[i] = calloc(feature_count, sizeof(uint64_t));
	}

	fprintf(features_csv, "address1, address2");
	for (i = 0; i < feature_count; ++i) {
		fprintf(features_csv, ", %s", feature_names[i]);
	}
	fprintf(features_csv, "\n");

	printf("Running feature extraction with %d functions and %d traces\n", feature_count, argc - 1);

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			uint64_t feature_values[MAX_FEATURES];
			light_option feature_option;
			light_option address_option;

			address_option = light_get_option(pcapng, LIGHT_CUSTOM_OPTION_ADDRESS_INFO);
			if (address_option != NULL) {
				uint8_t *label = (uint8_t *)light_get_option_data(address_option);
				if (*label == 4) {
					uint8_t source[4], destination[4];
					memcpy(source, label + 1, sizeof(uint32_t));
					memcpy(destination, label + 5, sizeof(uint32_t));
					fprintf(features_csv, "%u.%u.%u.%u, %u.%u.%u.%u",
							source[0], source[1], source[2], source[3],
							destination[0], destination[1], destination[2], destination[3]);
				}
				else if (*label == 6) {
					fprintf(features_csv, "ipv6, ipv6");
				}
				else {
					fprintf(features_csv, "unknown, unknown");
				}
			}
			else {
				fprintf(features_csv, "unknown, unknown");
			}

			printf("Extract features for %s\n", file);

			// Write output to file.
			for (j = 0; j < feature_count; ++j) {
				feature_values[j] = features[j](pcapng);
				fprintf(features_csv, ", %lu", feature_values[j]);

				// Save for later.
				feature_table[i - 1][j] = feature_values[j];

				if (feature_values[j] == -1) {
					// Invalid value.
					continue;
				}

				if (min_features[j] > feature_table[i - 1][j]) {
					min_features[j] = feature_table[i - 1][j];
				}
				if (max_features[j] < feature_table[i - 1][j]) {
					max_features[j] = feature_table[i - 1][j];
				}
			}
			fprintf(features_csv, "\n");

			// Update .pcapng traces with computed metrics.
			feature_option = light_create_option(LIGHT_CUSTOM_OPTION_FEATURE_U64, feature_count * sizeof(uint64_t), feature_values);
			light_update_option(pcapng, pcapng, feature_option);
			light_pcapng_to_file(file, pcapng);

			light_free_option(feature_option);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	fclose(features_csv);

	//////////////////////////////////////////////////////////////////////////////////////////////////////
	printf("Start exporting double features!\n");

	fprintf(features_raw, "%% %d features\n", feature_count);
	fprintf(features_raw, "%% %d items\n", argc - 1);

	for (i = 0; i < argc - 1; ++i) {
		for (j = 0; j < feature_count; ++j) {
			if (feature_table[i][j] == -1) {
				// Invalid feature.
				fprintf(features_raw, "%.6lf ", 0.0);
			}
			else {
				double f = (double)(feature_table[i][j] - min_features[j]) / (max_features[j] - min_features[j]);
				fprintf(features_raw, "%.6lf ", f);
			}
		}
		fprintf(features_raw, "\n");
	}
	fclose(features_raw);

	cleanup();

	return EXIT_SUCCESS;
}